

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LicenseReader.cpp
# Opt level: O3

EventRegistry * __thiscall
license::LicenseReader::readLicenses
          (EventRegistry *__return_storage_ptr__,LicenseReader *this,string *product,
          vector<license::FullLicenseInfo,_std::allocator<license::FullLicenseInfo>_>
          *licenseInfoOut)

{
  LocatorStrategy *pLVar1;
  char *pcVar2;
  _List_node_base *p_Var3;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar4;
  FUNCTION_RETURN FVar5;
  SI_Error SVar6;
  int iVar7;
  char *pcVar8;
  long lVar9;
  size_t sVar10;
  mapped_type *pmVar11;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *extraout_RAX;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *extraout_RAX_00;
  pointer licenseLocationId;
  _List_node_base *p_Var12;
  pointer puVar13;
  TNamesDepend keys;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  licenseLocations;
  string license;
  vector<std::unique_ptr<license::locate::LocatorStrategy,_std::default_delete<license::locate::LocatorStrategy>_>,_std::allocator<std::unique_ptr<license::locate::LocatorStrategy,_std::default_delete<license::locate::LocatorStrategy>_>_>_>
  locator_strategies;
  string product_up;
  FullLicenseInfo licInfo;
  allocator local_219;
  char *local_218;
  string local_210;
  ulong local_1f0;
  string *local_1e8;
  _List_node_base local_1e0;
  undefined8 local_1d0;
  pointer local_1c8;
  vector<license::FullLicenseInfo,_std::allocator<license::FullLicenseInfo>_> *local_1c0;
  pointer local_1b8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_1b0;
  char *local_198;
  size_t local_190;
  char local_188 [16];
  vector<std::unique_ptr<license::locate::LocatorStrategy,_std::default_delete<license::locate::LocatorStrategy>_>,_std::allocator<std::unique_ptr<license::locate::LocatorStrategy,_std::default_delete<license::locate::LocatorStrategy>_>_>_>
  local_178;
  CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_> local_158;
  string local_e8;
  FullLicenseInfo local_c8;
  
  local_178.
  super__Vector_base<std::unique_ptr<license::locate::LocatorStrategy,_std::default_delete<license::locate::LocatorStrategy>_>,_std::allocator<std::unique_ptr<license::locate::LocatorStrategy,_std::default_delete<license::locate::LocatorStrategy>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_178.
  super__Vector_base<std::unique_ptr<license::locate::LocatorStrategy,_std::default_delete<license::locate::LocatorStrategy>_>,_std::allocator<std::unique_ptr<license::locate::LocatorStrategy,_std::default_delete<license::locate::LocatorStrategy>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_178.
  super__Vector_base<std::unique_ptr<license::locate::LocatorStrategy,_std::default_delete<license::locate::LocatorStrategy>_>,_std::allocator<std::unique_ptr<license::locate::LocatorStrategy,_std::default_delete<license::locate::LocatorStrategy>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_1e8 = product;
  local_1c0 = licenseInfoOut;
  FVar5 = locate::LocatorFactory::get_active_strategies(&local_178,this->licenseLocation);
  EventRegistry::EventRegistry(__return_storage_ptr__);
  if (FVar5 != FUNC_RET_OK) {
    EventRegistry::addEvent(__return_storage_ptr__,IFF_UP,(char *)0x0,(char *)0x0);
    EventRegistry::turnWarningsIntoErrors(__return_storage_ptr__);
    goto LAB_00189d98;
  }
  toupper_copy(&local_e8,local_1e8);
  local_1c8 = local_178.
              super__Vector_base<std::unique_ptr<license::locate::LocatorStrategy,_std::default_delete<license::locate::LocatorStrategy>_>,_std::allocator<std::unique_ptr<license::locate::LocatorStrategy,_std::default_delete<license::locate::LocatorStrategy>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish;
  if (local_178.
      super__Vector_base<std::unique_ptr<license::locate::LocatorStrategy,_std::default_delete<license::locate::LocatorStrategy>_>,_std::allocator<std::unique_ptr<license::locate::LocatorStrategy,_std::default_delete<license::locate::LocatorStrategy>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start ==
      local_178.
      super__Vector_base<std::unique_ptr<license::locate::LocatorStrategy,_std::default_delete<license::locate::LocatorStrategy>_>,_std::allocator<std::unique_ptr<license::locate::LocatorStrategy,_std::default_delete<license::locate::LocatorStrategy>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
LAB_00189d75:
    EventRegistry::turnWarningsIntoErrors(__return_storage_ptr__);
  }
  else {
    local_218 = local_e8._M_dataplus._M_p;
    local_1f0 = 0;
    puVar13 = local_178.
              super__Vector_base<std::unique_ptr<license::locate::LocatorStrategy,_std::default_delete<license::locate::LocatorStrategy>_>,_std::allocator<std::unique_ptr<license::locate::LocatorStrategy,_std::default_delete<license::locate::LocatorStrategy>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    do {
      pLVar1 = (puVar13->_M_t).
               super___uniq_ptr_impl<license::locate::LocatorStrategy,_std::default_delete<license::locate::LocatorStrategy>_>
               ._M_t.
               super__Tuple_impl<0UL,_license::locate::LocatorStrategy_*,_std::default_delete<license::locate::LocatorStrategy>_>
               .super__Head_base<0UL,_license::locate::LocatorStrategy_*,_false>._M_head_impl;
      (*pLVar1->_vptr_LocatorStrategy[1])(&local_1b0,pLVar1,__return_storage_ptr__);
      if (local_1b0.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish !=
          local_1b0.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start) {
        local_158.m_data._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
        local_158.m_data._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
        local_158.m_pData = (char *)0x0;
        local_158.m_uDataLen = 0;
        local_158.m_pFileComment = (char *)0x0;
        local_158.m_data._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
             &local_158.m_data._M_t._M_impl.super__Rb_tree_header._M_header;
        local_158.m_data._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
        local_158.m_strings.
        super__List_base<CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::Entry,_std::allocator<CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::Entry>_>
        ._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)&local_158.m_strings;
        local_158.m_strings.
        super__List_base<CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::Entry,_std::allocator<CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::Entry>_>
        ._M_impl._M_node._M_size._0_7_ = 0;
        local_158._95_4_ = 0;
        local_158.m_bSpaces = true;
        local_158.m_nOrder = 0;
        licenseLocationId =
             local_1b0.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
        local_1b8 = puVar13;
        local_158.m_data._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
             local_158.m_data._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        local_158.m_strings.
        super__List_base<CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::Entry,_std::allocator<CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::Entry>_>
        ._M_impl._M_node.super__List_node_base._M_prev =
             local_158.m_strings.
             super__List_base<CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::Entry,_std::allocator<CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::Entry>_>
             ._M_impl._M_node.super__List_node_base._M_next;
        do {
          CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::Reset(&local_158);
          pLVar1 = (puVar13->_M_t).
                   super___uniq_ptr_impl<license::locate::LocatorStrategy,_std::default_delete<license::locate::LocatorStrategy>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_license::locate::LocatorStrategy_*,_std::default_delete<license::locate::LocatorStrategy>_>
                   .super__Head_base<0UL,_license::locate::LocatorStrategy_*,_false>._M_head_impl;
          std::__cxx11::string::string
                    ((string *)&local_c8,(licenseLocationId->_M_dataplus)._M_p,
                     (allocator *)&local_210);
          (*pLVar1->_vptr_LocatorStrategy[2])(&local_198,pLVar1,&local_c8);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_c8.license_signature._M_dataplus._M_p != &local_c8.license_signature.field_2)
          {
            operator_delete(local_c8.license_signature._M_dataplus._M_p);
          }
          SVar6 = CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::LoadData
                            (&local_158,local_198,local_190);
          if (SVar6 < SI_OK) {
            EventRegistry::addEvent
                      (__return_storage_ptr__,FILE_FORMAT_NOT_RECOGNIZED,licenseLocationId);
          }
          else {
            iVar7 = CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::
                    GetSectionSize(&local_158,local_218);
            if (iVar7 < 1) {
              EventRegistry::addEvent(__return_storage_ptr__,PARALLELS,licenseLocationId);
            }
            else {
              EventRegistry::addEvent(__return_storage_ptr__,PRODUCT_FOUND,licenseLocationId);
              pcVar2 = local_218;
              pcVar8 = CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::GetValue
                                 (&local_158,local_218,"sig",(char *)0x0,(bool *)0x0);
              lVar9 = CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::
                      GetLongValue(&local_158,pcVar2,"lic_ver",-1,(bool *)0x0);
              if ((pcVar8 == (char *)0x0) || (lVar9 != 200)) {
                EventRegistry::addEvent(__return_storage_ptr__,HV,licenseLocationId);
              }
              else {
                local_1d0 = 0;
                local_1e0._M_next = &local_1e0;
                local_1e0._M_prev = &local_1e0;
                CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::GetAllKeys
                          (&local_158,local_218,(TNamesDepend *)&local_1e0);
                local_210._M_dataplus._M_p = (pointer)&local_210.field_2;
                sVar10 = strlen(pcVar8);
                std::__cxx11::string::_M_construct<char_const*>
                          ((string *)&local_210,pcVar8,pcVar8 + sVar10);
                FullLicenseInfo::FullLicenseInfo(&local_c8,licenseLocationId,local_1e8,&local_210);
                p_Var12 = local_1e0._M_next;
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_210._M_dataplus._M_p != &local_210.field_2) {
                  operator_delete(local_210._M_dataplus._M_p);
                  p_Var12 = local_1e0._M_next;
                }
                for (; p_Var12 != &local_1e0;
                    p_Var12 = (((_List_base<CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::Entry,_std::allocator<CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::Entry>_>
                                 *)&p_Var12->_M_next)->_M_impl)._M_node.super__List_node_base.
                              _M_next) {
                  pcVar8 = CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::
                           GetValue(&local_158,local_218,(char *)p_Var12[1]._M_next,(char *)0x0,
                                    (bool *)0x0);
                  std::__cxx11::string::string
                            ((string *)&local_210,(char *)p_Var12[1]._M_next,&local_219);
                  pmVar11 = std::
                            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                            ::operator[](&local_c8.m_limits,&local_210);
                  pcVar2 = (char *)pmVar11->_M_string_length;
                  strlen(pcVar8);
                  std::__cxx11::string::_M_replace((ulong)pmVar11,0,pcVar2,(ulong)pcVar8);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_210._M_dataplus._M_p != &local_210.field_2) {
                    operator_delete(local_210._M_dataplus._M_p);
                  }
                }
                std::vector<license::FullLicenseInfo,_std::allocator<license::FullLicenseInfo>_>::
                push_back(local_1c0,&local_c8);
                puVar13 = local_1b8;
                std::
                _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ::~_Rb_tree(&local_c8.m_limits._M_t);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_c8.m_project._M_dataplus._M_p != &local_c8.m_project.field_2) {
                  operator_delete(local_c8.m_project._M_dataplus._M_p);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_c8.source._M_dataplus._M_p != &local_c8.source.field_2) {
                  operator_delete(local_c8.source._M_dataplus._M_p);
                }
                paVar4 = &local_c8.license_signature.field_2;
                p_Var12 = local_1e0._M_next;
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_c8.license_signature._M_dataplus._M_p != paVar4) {
                  operator_delete(local_c8.license_signature._M_dataplus._M_p);
                  paVar4 = extraout_RAX;
                  p_Var12 = local_1e0._M_next;
                }
                while (p_Var12 != &local_1e0) {
                  p_Var3 = p_Var12->_M_next;
                  operator_delete(p_Var12);
                  paVar4 = extraout_RAX_00;
                  p_Var12 = p_Var3;
                }
                local_1f0 = CONCAT71((int7)((ulong)paVar4 >> 8),1);
              }
            }
          }
          if (local_198 != local_188) {
            operator_delete(local_198);
          }
          licenseLocationId = licenseLocationId + 1;
        } while (licenseLocationId !=
                 local_1b0.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish);
        CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::~CSimpleIniTempl
                  (&local_158);
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_1b0);
      puVar13 = puVar13 + 1;
    } while (puVar13 != local_1c8);
    if ((local_1f0 & 1) == 0) goto LAB_00189d75;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
    operator_delete(local_e8._M_dataplus._M_p);
  }
LAB_00189d98:
  std::
  vector<std::unique_ptr<license::locate::LocatorStrategy,_std::default_delete<license::locate::LocatorStrategy>_>,_std::allocator<std::unique_ptr<license::locate::LocatorStrategy,_std::default_delete<license::locate::LocatorStrategy>_>_>_>
  ::~vector(&local_178);
  return __return_storage_ptr__;
}

Assistant:

EventRegistry LicenseReader::readLicenses(const string &product, vector<FullLicenseInfo> &licenseInfoOut) const {
	vector<unique_ptr<locate::LocatorStrategy>> locator_strategies;
	FUNCTION_RETURN ret = locate::LocatorFactory::get_active_strategies(locator_strategies, licenseLocation);
	EventRegistry eventRegistry;
	if (ret != FUNC_RET_OK) {
		eventRegistry.addEvent(LICENSE_FILE_NOT_FOUND);
		eventRegistry.turnWarningsIntoErrors();
		return eventRegistry;
	}

	bool atLeastOneLicenseComplete = false;
	const string product_up = toupper_copy(product);
	const char *productNamePtr = product_up.c_str();
	for (unique_ptr<locate::LocatorStrategy> &locator : locator_strategies) {
		vector<string> licenseLocations = locator->license_locations(eventRegistry);
		if (licenseLocations.size() == 0) {
			continue;
		}
		CSimpleIniA ini;
		for (auto it = licenseLocations.begin(); it != licenseLocations.end(); it++) {
			ini.Reset();
			const string license = locator->retrieve_license_content((*it).c_str());
			const SI_Error rc = ini.LoadData(license.c_str(), license.size());
			if (rc < 0) {
				eventRegistry.addEvent(FILE_FORMAT_NOT_RECOGNIZED, *it);
				continue;
			}
			const int sectionSize = ini.GetSectionSize(productNamePtr);
			if (sectionSize <= 0) {
				eventRegistry.addEvent(PRODUCT_NOT_LICENSED, *it);
				continue;
			} else {
				eventRegistry.addEvent(PRODUCT_FOUND, *it);
			}
			/*
			 *  sw_version_from = (optional int)
			 *  sw_version_to = (optional int)
			 *  from_date = YYYY-MM-DD (optional)
			 *  to_date  = YYYY-MM-DD (optional)
			 *  client_signature = XXXX-XXXX-XXXX (optional string 16)
			 *  sig = XXXXXXXXXX (mandatory, 1024)
			 *  application_data = xxxxxxxxx (optional string 16)
			 */
			const char *license_signature = ini.GetValue(productNamePtr, LICENSE_SIGNATURE, nullptr);
			long license_version = ini.GetLongValue(productNamePtr, LICENSE_VERSION, -1);
			if (license_signature != nullptr && license_version == 200) {
				CSimpleIniA::TNamesDepend keys;
				ini.GetAllKeys(productNamePtr, keys);
				FullLicenseInfo licInfo(*it, product, license_signature);
				for (auto &it : keys) {
					licInfo.m_limits[it.pItem] = ini.GetValue(productNamePtr, it.pItem, nullptr);
				}
				licenseInfoOut.push_back(licInfo);
				atLeastOneLicenseComplete = true;
			} else {
				eventRegistry.addEvent(LICENSE_MALFORMED, *it);
			}
		}
	}
	if (!atLeastOneLicenseComplete) {
		eventRegistry.turnWarningsIntoErrors();
	}
	return eventRegistry;
}